

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void open_cb_simple(uv_fs_t *req)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uv_fs_t *extraout_RAX;
  undefined8 uVar5;
  undefined1 *__s1;
  undefined8 uVar6;
  __off64_t _Var7;
  void *pvVar8;
  void *pvVar9;
  char *pcVar10;
  uv_fs_t *puVar11;
  undefined1 *puVar12;
  long unaff_R12;
  char *pcVar13;
  uv_fs_t *unaff_R14;
  ulong uVar14;
  long lVar15;
  void *pvVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uv_buf_t uVar19;
  undefined1 auStack_4aa [2];
  code *pcStack_4a8;
  undefined8 uStack_4a0;
  long lStack_490;
  void *pvStack_488;
  long lStack_480;
  undefined1 auStack_410 [16];
  undefined1 auStack_400 [16];
  undefined8 uStack_3e8;
  uv_fs_t *puStack_3e0;
  uv_fs_t *puStack_3d8;
  undefined8 uStack_3d0;
  code *pcStack_3c0;
  code *pcStack_3b8;
  undefined8 uStack_3b0;
  undefined1 auStack_3a0 [16];
  undefined1 auStack_390 [16];
  undefined1 auStack_380 [16];
  undefined1 auStack_370 [16];
  undefined1 auStack_360 [256];
  undefined1 auStack_260 [256];
  undefined1 auStack_160 [128];
  undefined1 auStack_e0 [136];
  undefined1 *puStack_58;
  
  if (req->fs_type == UV_FS_OPEN) {
    puVar11 = (uv_fs_t *)req->result;
    if ((long)puVar11 < 0) goto LAB_00160838;
    open_cb_count = open_cb_count + 1;
    puVar11 = req;
    if (req->path != (char *)0x0) {
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    open_cb_simple_cold_1();
    puVar11 = extraout_RAX;
LAB_00160838:
    open_cb_simple_cold_3();
  }
  iVar2 = (int)puVar11;
  open_cb_simple_cold_2();
  fs_file_open_append(iVar2);
  fs_file_open_append(iVar2);
  uVar5 = uv_default_loop();
  uv_walk(uVar5,close_walk_cb,0);
  uv_run(uVar5,0);
  uVar5 = uv_default_loop();
  iVar2 = uv_loop_close(uVar5);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_file_open_append_cold_1();
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    fs_file_open_append_cold_1();
LAB_00160bc6:
    fs_file_open_append_cold_2();
LAB_00160bcb:
    fs_file_open_append_cold_3();
LAB_00160bd0:
    fs_file_open_append_cold_4();
LAB_00160bd5:
    fs_file_open_append_cold_5();
LAB_00160bda:
    fs_file_open_append_cold_6();
LAB_00160bdf:
    fs_file_open_append_cold_7();
LAB_00160be4:
    fs_file_open_append_cold_8();
LAB_00160be9:
    fs_file_open_append_cold_9();
LAB_00160bee:
    fs_file_open_append_cold_10();
LAB_00160bf3:
    fs_file_open_append_cold_11();
LAB_00160bf8:
    fs_file_open_append_cold_12();
LAB_00160bfd:
    fs_file_open_append_cold_13();
LAB_00160c02:
    fs_file_open_append_cold_14();
LAB_00160c07:
    fs_file_open_append_cold_15();
LAB_00160c0c:
    fs_file_open_append_cold_16();
LAB_00160c11:
    fs_file_open_append_cold_17();
LAB_00160c16:
    fs_file_open_append_cold_18();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00160bc6;
    uv_fs_req_cleanup(&open_req1);
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00160bcb;
    if (write_req.result < 0) goto LAB_00160bd0;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00160bd5;
    if (close_req.result != 0) goto LAB_00160bda;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x402,0,0);
    if (iVar2 < 0) goto LAB_00160bdf;
    if (open_req1.result._4_4_ < 0) goto LAB_00160be4;
    uv_fs_req_cleanup(&open_req1);
    uVar19 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iov = uVar19;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00160be9;
    if (write_req.result < 0) goto LAB_00160bee;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00160bf3;
    if (close_req.result != 0) goto LAB_00160bf8;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0x100,0);
    if (iVar2 < 0) goto LAB_00160bfd;
    if (open_req1.result._4_4_ < 0) goto LAB_00160c02;
    uv_fs_req_cleanup(&open_req1);
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    iov = uVar19;
    uVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    printf("read = %d\n",(ulong)uVar3);
    if (uVar3 != 0x1a) goto LAB_00160c07;
    if (read_req.result != 0x1a) goto LAB_00160c0c;
    auVar18[0] = -(buf[10] == 'r');
    auVar18[1] = -(buf[0xb] == '\n');
    auVar18[2] = -(buf[0xc] == '\0');
    auVar18[3] = -(buf[0xd] == 't');
    auVar18[4] = -(buf[0xe] == 'e');
    auVar18[5] = -(buf[0xf] == 's');
    auVar18[6] = -(buf[0x10] == 't');
    auVar18[7] = -(buf[0x11] == '-');
    auVar18[8] = -(buf[0x12] == 'b');
    auVar18[9] = -(buf[0x13] == 'u');
    auVar18[10] = -(buf[0x14] == 'f');
    auVar18[0xb] = -(buf[0x15] == 'f');
    auVar18[0xc] = -(buf[0x16] == 'e');
    auVar18[0xd] = -(buf[0x17] == 'r');
    auVar18[0xe] = -(buf[0x18] == '\n');
    auVar18[0xf] = -(buf[0x19] == '\0');
    auVar17[0] = -(buf[0] == 't');
    auVar17[1] = -(buf[1] == 'e');
    auVar17[2] = -(buf[2] == 's');
    auVar17[3] = -(buf[3] == 't');
    auVar17[4] = -(buf[4] == '-');
    auVar17[5] = -(buf[5] == 'b');
    auVar17[6] = -(buf[6] == 'u');
    auVar17[7] = -(buf[7] == 'f');
    auVar17[8] = -(buf[8] == 'f');
    auVar17[9] = -(buf[9] == 'e');
    auVar17[10] = -(buf[10] == 'r');
    auVar17[0xb] = -(buf[0xb] == '\n');
    auVar17[0xc] = -(buf[0xc] == '\0');
    auVar17[0xd] = -(buf[0xd] == 't');
    auVar17[0xe] = -(buf[0xe] == 'e');
    auVar17[0xf] = -(buf[0xf] == 's');
    auVar17 = auVar17 & auVar18;
    if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160c11;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00160c16;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  fs_file_open_append_cold_19();
  unlink("test_file");
  unlink("test_file2");
  loop = (uv_loop_t *)uv_default_loop();
  iVar4 = 0;
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    run_test_fs_rename_to_existing_file_cold_1();
LAB_00160f66:
    run_test_fs_rename_to_existing_file_cold_2();
LAB_00160f6b:
    run_test_fs_rename_to_existing_file_cold_3();
LAB_00160f70:
    run_test_fs_rename_to_existing_file_cold_4();
LAB_00160f75:
    run_test_fs_rename_to_existing_file_cold_5();
LAB_00160f7a:
    run_test_fs_rename_to_existing_file_cold_6();
LAB_00160f7f:
    run_test_fs_rename_to_existing_file_cold_7();
LAB_00160f84:
    run_test_fs_rename_to_existing_file_cold_8();
LAB_00160f89:
    run_test_fs_rename_to_existing_file_cold_9();
LAB_00160f8e:
    run_test_fs_rename_to_existing_file_cold_10();
LAB_00160f93:
    run_test_fs_rename_to_existing_file_cold_11();
LAB_00160f98:
    run_test_fs_rename_to_existing_file_cold_12();
LAB_00160f9d:
    run_test_fs_rename_to_existing_file_cold_13();
LAB_00160fa2:
    run_test_fs_rename_to_existing_file_cold_14();
LAB_00160fa7:
    run_test_fs_rename_to_existing_file_cold_15();
LAB_00160fac:
    run_test_fs_rename_to_existing_file_cold_16();
LAB_00160fb1:
    run_test_fs_rename_to_existing_file_cold_17();
LAB_00160fb6:
    run_test_fs_rename_to_existing_file_cold_18();
LAB_00160fbb:
    run_test_fs_rename_to_existing_file_cold_19();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00160f66;
    uv_fs_req_cleanup(&open_req1);
    uVar19 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iVar4 = 0;
    iov = uVar19;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00160f6b;
    if (write_req.result < 0) goto LAB_00160f70;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00160f75;
    if (close_req.result != 0) goto LAB_00160f7a;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file2",0x41,0x180,0);
    if (iVar2 < 0) goto LAB_00160f7f;
    if (open_req1.result._4_4_ < 0) goto LAB_00160f84;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00160f89;
    if (close_req.result != 0) goto LAB_00160f8e;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar2 = uv_fs_rename(0,&rename_req,"test_file","test_file2",0);
    if (iVar2 != 0) goto LAB_00160f93;
    if (rename_req.result != 0) goto LAB_00160f98;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file2",0,0,0);
    if (iVar2 < 0) goto LAB_00160f9d;
    if (open_req1.result._4_4_ < 0) goto LAB_00160fa2;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar4 = 0;
    iov = uVar19;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00160fa7;
    if (read_req.result < 0) goto LAB_00160fac;
    iVar4 = 0x2f84e0;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00160fb1;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00160fb6;
    if (close_req.result != 0) goto LAB_00160fbb;
    uv_fs_req_cleanup(&close_req);
    unlink("test_file");
    unlink("test_file2");
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    uv_run(uVar5,0);
    iVar4 = uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      uv_library_shutdown();
      return;
    }
  }
  run_test_fs_rename_to_existing_file_cold_20();
  fs_read_bufs(iVar4);
  fs_read_bufs(iVar4);
  __s1 = (undefined1 *)uv_default_loop();
  uv_walk(__s1,close_walk_cb,0);
  uv_run(__s1,0);
  uv_default_loop();
  iVar2 = uv_loop_close();
  if (iVar2 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_read_bufs_cold_1();
  iVar4 = 0;
  pcStack_3b8 = (code *)0x161039;
  puStack_58 = __s1;
  iVar2 = uv_fs_open(0,&open_req1,"test/fixtures/lorem_ipsum.txt",0,0,0);
  if (iVar2 < 0) {
    pcStack_3b8 = (code *)0x161271;
    fs_read_bufs_cold_1();
LAB_00161271:
    pcStack_3b8 = (code *)0x161276;
    fs_read_bufs_cold_2();
LAB_00161276:
    pcStack_3b8 = (code *)0x16127b;
    fs_read_bufs_cold_3();
LAB_0016127b:
    pcStack_3b8 = (code *)0x161280;
    fs_read_bufs_cold_4();
LAB_00161280:
    pcStack_3b8 = (code *)0x161285;
    fs_read_bufs_cold_5();
LAB_00161285:
    pcStack_3b8 = (code *)0x16128a;
    fs_read_bufs_cold_6();
LAB_0016128a:
    pcStack_3b8 = (code *)0x16128f;
    fs_read_bufs_cold_7();
LAB_0016128f:
    pcStack_3b8 = (code *)0x161294;
    fs_read_bufs_cold_8();
LAB_00161294:
    pcStack_3b8 = (code *)0x161299;
    fs_read_bufs_cold_9();
LAB_00161299:
    pcStack_3b8 = (code *)0x16129e;
    fs_read_bufs_cold_10();
LAB_0016129e:
    pcStack_3b8 = (code *)0x1612a3;
    fs_read_bufs_cold_11();
LAB_001612a3:
    pcStack_3b8 = (code *)0x1612a8;
    fs_read_bufs_cold_12();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00161271;
    pcStack_3b8 = (code *)0x16105b;
    uv_fs_req_cleanup();
    uStack_3b0 = 0;
    iVar4 = 0;
    pcStack_3b8 = (code *)0x16107f;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,0,0,0);
    if (iVar2 != -0x16) goto LAB_00161276;
    uStack_3b0 = 0;
    iVar4 = 0;
    pcStack_3b8 = (code *)0x1610af;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,0,1,0);
    if (iVar2 != -0x16) goto LAB_0016127b;
    uStack_3b0 = 0;
    iVar4 = 0;
    pcStack_3b8 = (code *)0x1610df;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_3a0,0,0);
    if (iVar2 != -0x16) goto LAB_00161280;
    pcStack_3b8 = (code *)0x1610f7;
    auStack_3a0 = uv_buf_init(auStack_360,0x100);
    __s1 = auStack_3a0;
    pcStack_3b8 = (code *)0x161115;
    auStack_390 = uv_buf_init(auStack_260,0x100);
    pcStack_3b8 = (code *)0x16112f;
    auStack_380 = uv_buf_init(auStack_160,0x80);
    pcStack_3b8 = (code *)0x161149;
    auStack_370 = uv_buf_init(auStack_e0,0x80);
    uStack_3b0 = 0;
    iVar4 = 0;
    pcStack_3b8 = (code *)0x161179;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,__s1,2,0);
    if (iVar2 != 0x1be) goto LAB_00161285;
    if (read_req.result != 0x1be) goto LAB_0016128a;
    __s1 = auStack_380;
    unaff_R14 = &read_req;
    pcStack_3b8 = (code *)0x1611a9;
    uv_fs_req_cleanup();
    uStack_3b0 = 0;
    iVar4 = 0;
    pcStack_3b8 = (code *)0x1611d0;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,__s1,2,0x100);
    if (iVar2 != 0xbe) goto LAB_0016128f;
    if (read_req.result != 0xbe) goto LAB_00161294;
    pcStack_3b8 = (code *)0x1611f8;
    uv_fs_req_cleanup(&read_req);
    __s1 = (undefined1 *)auStack_390._0_8_;
    pcStack_3b8 = (code *)0x16120f;
    puVar12 = (undefined1 *)auStack_390._0_8_;
    iVar2 = bcmp((void *)auStack_390._0_8_,(void *)auStack_380._0_8_,0x80);
    iVar4 = (int)puVar12;
    if (iVar2 != 0) goto LAB_00161299;
    __s1 = __s1 + 0x80;
    pcStack_3b8 = (code *)0x16122d;
    puVar12 = __s1;
    iVar2 = bcmp(__s1,(void *)auStack_370._0_8_,0x3e);
    iVar4 = (int)puVar12;
    if (iVar2 != 0) goto LAB_0016129e;
    iVar4 = 0;
    pcStack_3b8 = (code *)0x161247;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_001612a3;
    if (close_req.result == 0) {
      pcStack_3b8 = (code *)0x161261;
      uv_fs_req_cleanup(&close_req);
      return;
    }
  }
  pcStack_3b8 = run_test_fs_read_file_eof;
  fs_read_bufs_cold_13();
  pcStack_3c0 = (code *)0x1612b3;
  pcStack_3b8 = (code *)__s1;
  fs_read_file_eof(iVar4);
  pcStack_3c0 = (code *)0x1612b8;
  fs_read_file_eof(iVar4);
  pcStack_3c0 = (code *)0x1612bd;
  uVar5 = uv_default_loop();
  pcStack_3c0 = (code *)0x1612d1;
  uv_walk(uVar5,close_walk_cb,0);
  pcStack_3c0 = (code *)0x1612db;
  uv_run(uVar5,0);
  pcStack_3c0 = (code *)0x1612e0;
  uVar6 = uv_default_loop();
  pcStack_3c0 = (code *)0x1612e8;
  iVar2 = uv_loop_close(uVar6);
  if (iVar2 == 0) {
    pcStack_3c0 = (code *)0x1612f1;
    uv_library_shutdown();
    return;
  }
  pcStack_3c0 = fs_read_file_eof;
  run_test_fs_read_file_eof_cold_1();
  puVar11 = (uv_fs_t *)0x193537;
  puStack_3d8 = (uv_fs_t *)0x16130e;
  pcStack_3c0 = (code *)uVar5;
  unlink("test_file");
  puStack_3d8 = (uv_fs_t *)0x161313;
  loop = (uv_loop_t *)uv_default_loop();
  iVar4 = 0;
  puStack_3d8 = (uv_fs_t *)0x161339;
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    puStack_3d8 = (uv_fs_t *)0x161596;
    fs_read_file_eof_cold_1();
LAB_00161596:
    puStack_3d8 = (uv_fs_t *)0x16159b;
    fs_read_file_eof_cold_2();
LAB_0016159b:
    puStack_3d8 = (uv_fs_t *)0x1615a0;
    fs_read_file_eof_cold_3();
LAB_001615a0:
    puStack_3d8 = (uv_fs_t *)0x1615a5;
    fs_read_file_eof_cold_4();
LAB_001615a5:
    puStack_3d8 = (uv_fs_t *)0x1615aa;
    fs_read_file_eof_cold_5();
LAB_001615aa:
    puStack_3d8 = (uv_fs_t *)0x1615af;
    fs_read_file_eof_cold_6();
LAB_001615af:
    puStack_3d8 = (uv_fs_t *)0x1615b4;
    fs_read_file_eof_cold_7();
LAB_001615b4:
    puStack_3d8 = (uv_fs_t *)0x1615b9;
    fs_read_file_eof_cold_8();
LAB_001615b9:
    puStack_3d8 = (uv_fs_t *)0x1615be;
    fs_read_file_eof_cold_9();
LAB_001615be:
    puStack_3d8 = (uv_fs_t *)0x1615c3;
    fs_read_file_eof_cold_10();
LAB_001615c3:
    puStack_3d8 = (uv_fs_t *)0x1615c8;
    fs_read_file_eof_cold_11();
LAB_001615c8:
    puStack_3d8 = (uv_fs_t *)0x1615cd;
    fs_read_file_eof_cold_12();
LAB_001615cd:
    puStack_3d8 = (uv_fs_t *)0x1615d2;
    fs_read_file_eof_cold_13();
LAB_001615d2:
    puStack_3d8 = (uv_fs_t *)0x1615d7;
    fs_read_file_eof_cold_14();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00161596;
    puStack_3d8 = (uv_fs_t *)0x16135b;
    uv_fs_req_cleanup(&open_req1);
    puStack_3d8 = (uv_fs_t *)0x16136c;
    uVar19 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_3d0 = 0;
    iVar4 = 0;
    puStack_3d8 = (uv_fs_t *)0x1613aa;
    iov = uVar19;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_0016159b;
    if (write_req.result < 0) goto LAB_001615a0;
    puStack_3d8 = (uv_fs_t *)0x1613cc;
    uv_fs_req_cleanup();
    iVar4 = 0;
    puStack_3d8 = (uv_fs_t *)0x1613e2;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_001615a5;
    if (close_req.result != 0) goto LAB_001615aa;
    puStack_3d8 = (uv_fs_t *)0x161404;
    uv_fs_req_cleanup();
    iVar4 = 0;
    puStack_3d8 = (uv_fs_t *)0x161421;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar2 < 0) goto LAB_001615af;
    if (open_req1.result._4_4_ < 0) goto LAB_001615b4;
    puStack_3d8 = (uv_fs_t *)0x161443;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_3d8 = (uv_fs_t *)0x161465;
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_3d0 = 0;
    iVar4 = 0;
    puStack_3d8 = (uv_fs_t *)0x1614a3;
    iov = uVar19;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_001615b9;
    if (read_req.result < 0) goto LAB_001615be;
    iVar4 = 0x2f84e0;
    puStack_3d8 = (uv_fs_t *)0x1614cc;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_001615c3;
    puVar11 = &read_req;
    puStack_3d8 = (uv_fs_t *)0x1614e3;
    uv_fs_req_cleanup(&read_req);
    puStack_3d8 = (uv_fs_t *)0x1614f4;
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_3d0 = 0;
    iVar4 = 0;
    puStack_3d8 = (uv_fs_t *)0x16152e;
    iov = uVar19;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,read_req.result);
    if (iVar2 != 0) goto LAB_001615c8;
    if (read_req.result != 0) goto LAB_001615cd;
    puStack_3d8 = (uv_fs_t *)0x161550;
    uv_fs_req_cleanup();
    iVar4 = 0;
    puStack_3d8 = (uv_fs_t *)0x161566;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_001615d2;
    if (close_req.result == 0) {
      puStack_3d8 = (uv_fs_t *)0x161580;
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  puStack_3d8 = (uv_fs_t *)run_test_fs_write_multiple_bufs;
  fs_read_file_eof_cold_15();
  puStack_3e0 = (uv_fs_t *)0x1615e2;
  puStack_3d8 = puVar11;
  fs_write_multiple_bufs(iVar4);
  puStack_3e0 = (uv_fs_t *)0x1615e7;
  fs_write_multiple_bufs(iVar4);
  puStack_3e0 = (uv_fs_t *)0x1615ec;
  uVar5 = uv_default_loop();
  puStack_3e0 = (uv_fs_t *)0x161600;
  uv_walk(uVar5,close_walk_cb,0);
  puStack_3e0 = (uv_fs_t *)0x16160a;
  uv_run(uVar5,0);
  puStack_3e0 = (uv_fs_t *)0x16160f;
  uVar6 = uv_default_loop();
  puStack_3e0 = (uv_fs_t *)0x161617;
  iVar2 = uv_loop_close(uVar6);
  if (iVar2 == 0) {
    puStack_3e0 = (uv_fs_t *)0x161620;
    uv_library_shutdown();
    return;
  }
  puStack_3e0 = (uv_fs_t *)fs_write_multiple_bufs;
  run_test_fs_write_multiple_bufs_cold_1();
  uStack_3e8 = uVar5;
  puStack_3e0 = unaff_R14;
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = 0;
  iVar4 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar4 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_00161abc:
    fs_write_multiple_bufs_cold_2();
LAB_00161ac1:
    fs_write_multiple_bufs_cold_3();
LAB_00161ac6:
    fs_write_multiple_bufs_cold_4();
LAB_00161acb:
    fs_write_multiple_bufs_cold_5();
LAB_00161ad0:
    fs_write_multiple_bufs_cold_6();
LAB_00161ad5:
    fs_write_multiple_bufs_cold_7();
LAB_00161ada:
    fs_write_multiple_bufs_cold_8();
LAB_00161adf:
    fs_write_multiple_bufs_cold_9();
LAB_00161ae4:
    fs_write_multiple_bufs_cold_10();
LAB_00161ae9:
    fs_write_multiple_bufs_cold_11();
LAB_00161aee:
    fs_write_multiple_bufs_cold_12();
LAB_00161af3:
    fs_write_multiple_bufs_cold_13();
LAB_00161af8:
    fs_write_multiple_bufs_cold_14();
LAB_00161afd:
    fs_write_multiple_bufs_cold_15();
LAB_00161b02:
    fs_write_multiple_bufs_cold_16();
LAB_00161b07:
    fs_write_multiple_bufs_cold_19();
LAB_00161b0c:
    fs_write_multiple_bufs_cold_20();
LAB_00161b11:
    fs_write_multiple_bufs_cold_21();
LAB_00161b16:
    fs_write_multiple_bufs_cold_22();
LAB_00161b1b:
    fs_write_multiple_bufs_cold_23();
LAB_00161b20:
    fs_write_multiple_bufs_cold_24();
LAB_00161b25:
    fs_write_multiple_bufs_cold_25();
LAB_00161b2a:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00161abc;
    uv_fs_req_cleanup(&open_req1);
    auStack_410 = uv_buf_init(test_buf,0xd);
    auStack_400 = uv_buf_init(test_buf2,0xf);
    iVar2 = 0;
    iVar4 = uv_fs_write(0,&write_req,(int)open_req1.result,auStack_410,2,0);
    if (iVar4 < 0) goto LAB_00161ac1;
    if (write_req.result < 0) goto LAB_00161ac6;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_00161acb;
    if (close_req.result != 0) goto LAB_00161ad0;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar4 < 0) goto LAB_00161ad5;
    if (open_req1.result._4_4_ < 0) goto LAB_00161ada;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    auVar17 = uv_buf_init(buf,0xd);
    auStack_410 = auVar17;
    auVar17 = uv_buf_init(buf2);
    iVar2 = (int)open_req1.result;
    auStack_400 = auVar17;
    _Var7 = lseek64((int)open_req1.result,0,1);
    if (_Var7 != 0) goto LAB_00161adf;
    iVar2 = 0;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_410,2,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00161ae4;
    if (read_req.result != 0x1c) goto LAB_00161ae9;
    iVar2 = 0x2f84e0;
    iVar4 = strcmp(buf,test_buf);
    if (iVar4 != 0) goto LAB_00161aee;
    iVar2 = 0x2fa4d0;
    iVar4 = strcmp(buf2,test_buf2);
    if (iVar4 != 0) goto LAB_00161af3;
    uv_fs_req_cleanup(&read_req);
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar19;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar4 != 0) goto LAB_00161af8;
    if (read_req.result != 0) goto LAB_00161afd;
    uv_fs_req_cleanup(&read_req);
    auVar17 = uv_buf_init(buf,0xd);
    auStack_410 = auVar17;
    auVar17 = uv_buf_init(buf2,0xf);
    iVar2 = 0;
    auStack_400 = auVar17;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_410,2,0);
    if (iVar4 < 0) goto LAB_00161b02;
    if (read_req.result == 0x1c) {
LAB_001619ba:
      iVar2 = 0x2f84e0;
      iVar4 = strcmp(buf,test_buf);
      if (iVar4 != 0) goto LAB_00161b07;
      iVar2 = 0x2fa4d0;
      iVar4 = strcmp(buf2,test_buf2);
      if (iVar4 != 0) goto LAB_00161b0c;
      uv_fs_req_cleanup(&read_req);
      uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
      iVar2 = 0;
      iov = uVar19;
      iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0x1c);
      if (iVar4 != 0) goto LAB_00161b11;
      if (read_req.result != 0) goto LAB_00161b16;
      uv_fs_req_cleanup();
      iVar2 = 0;
      iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
      if (iVar4 != 0) goto LAB_00161b1b;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        unlink("test_file");
        return;
      }
      goto LAB_00161b20;
    }
    if (read_req.result != 0xd) goto LAB_00161b25;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_400,1,read_req.result);
    if (iVar4 < 0) goto LAB_00161b2a;
    if (read_req.result == 0xf) goto LAB_001619ba;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar2);
  fs_write_alotof_bufs(iVar2);
  uVar5 = uv_default_loop();
  uv_walk(uVar5,close_walk_cb,0);
  uv_run(uVar5,0);
  uVar5 = uv_default_loop();
  iVar2 = uv_loop_close(uVar5);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = 0xd4310;
  pvVar8 = malloc(0xd4310);
  if (pvVar8 == (void *)0x0) {
LAB_00161eb1:
    fs_write_alotof_bufs_cold_18();
LAB_00161eb6:
    fs_write_alotof_bufs_cold_1();
LAB_00161ebb:
    fs_write_alotof_bufs_cold_2();
LAB_00161ec0:
    fs_write_alotof_bufs_cold_3();
LAB_00161ec5:
    fs_write_alotof_bufs_cold_4();
LAB_00161eca:
    fs_write_alotof_bufs_cold_17();
LAB_00161ecf:
    fs_write_alotof_bufs_cold_5();
LAB_00161ed4:
    fs_write_alotof_bufs_cold_6();
LAB_00161ed9:
    fs_write_alotof_bufs_cold_7();
LAB_00161ede:
    fs_write_alotof_bufs_cold_8();
LAB_00161ee3:
    fs_write_alotof_bufs_cold_9();
LAB_00161ee8:
    fs_write_alotof_bufs_cold_10();
LAB_00161eed:
    fs_write_alotof_bufs_cold_12();
LAB_00161ef2:
    fs_write_alotof_bufs_cold_13();
LAB_00161ef7:
    fs_write_alotof_bufs_cold_14();
LAB_00161efc:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar2 = 0;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar4 < 0) goto LAB_00161eb6;
    if (open_req1.result._4_4_ < 0) goto LAB_00161ebb;
    uv_fs_req_cleanup(&open_req1);
    lVar15 = 8;
    do {
      auVar17 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar8 + lVar15 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar8 + lVar15) = auVar17._8_8_;
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0xd4318);
    iVar2 = 0;
    iVar4 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar8,0xd431,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00161ec0;
    if (write_req.result != 0xac67d) goto LAB_00161ec5;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0xac67d;
    pvVar9 = malloc(0xac67d);
    if (pvVar9 == (void *)0x0) goto LAB_00161eca;
    lVar15 = 8;
    pvVar16 = pvVar9;
    do {
      auVar17 = uv_buf_init(pvVar16,0xd);
      *(long *)((long)pvVar8 + lVar15 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar8 + lVar15) = auVar17._8_8_;
      lVar15 = lVar15 + 0x10;
      pvVar16 = (void *)((long)pvVar16 + 0xd);
    } while (lVar15 != 0xd4318);
    iVar2 = 0;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    unaff_R12 = 0xd4318;
    if (iVar4 != 0) goto LAB_00161ecf;
    if (close_req.result != 0) goto LAB_00161ed4;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar4 < 0) goto LAB_00161ed9;
    if (open_req1.result._4_4_ < 0) goto LAB_00161ede;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar8,0xd431,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00161ee3;
    if (read_req.result != 0x3400) goto LAB_00161ee8;
    unaff_R12 = 0;
    do {
      pcVar10 = (char *)((long)pvVar9 + unaff_R12);
      iVar4 = strncmp(pcVar10,test_buf,0xd);
      iVar2 = (int)pcVar10;
      if (iVar4 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_00161eb1;
      }
      unaff_R12 = unaff_R12 + 0xd;
    } while (unaff_R12 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pvVar9);
    iVar2 = (int)open_req1.result;
    _Var7 = lseek64((int)open_req1.result,write_req.result,0);
    if (_Var7 != write_req.result) goto LAB_00161eed;
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar19;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar4 != 0) goto LAB_00161ef2;
    if (read_req.result != 0) goto LAB_00161ef7;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_00161efc;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(pvVar8);
      return;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar2);
  fs_write_alotof_bufs_with_offset(iVar2);
  pvVar8 = (void *)uv_default_loop();
  uv_walk(pvVar8,close_walk_cb,0);
  uv_run(pvVar8,0);
  uVar5 = uv_default_loop();
  iVar2 = uv_loop_close(uVar5);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  pcStack_4a8 = (code *)0x161f6d;
  pvStack_488 = pvVar8;
  lStack_480 = unaff_R12;
  unlink("test_file");
  pcStack_4a8 = (code *)0x161f72;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_4a8 = (code *)0x161f83;
  pvVar9 = malloc(0xd4310);
  if (pvVar9 == (void *)0x0) {
LAB_001622cf:
    pvVar9 = pvVar8;
    pcStack_4a8 = (code *)0x1622d4;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_001622d4:
    pcStack_4a8 = (code *)0x1622d9;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_001622d9:
    pcStack_4a8 = (code *)0x1622de;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_001622de:
    pcStack_4a8 = (code *)0x1622e3;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_001622e3:
    pcStack_4a8 = (code *)0x1622e8;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_001622e8:
    pcStack_4a8 = (code *)0x1622ed;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_001622ed:
    pcStack_4a8 = (code *)0x1622f2;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_001622f2:
    pcStack_4a8 = (code *)0x1622f7;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_001622f7:
    pcStack_4a8 = (code *)0x1622fc;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_001622fc:
    pcStack_4a8 = (code *)0x162301;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00162301:
    pcStack_4a8 = (code *)0x162306;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00162306:
    pcStack_4a8 = (code *)0x16230b;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_0016230b:
    pcStack_4a8 = (code *)0x162310;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00162310:
    pcStack_4a8 = (code *)0x162315;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00162315:
    pcStack_4a8 = (code *)0x16231a;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    pcStack_4a8 = (code *)0x161fb2;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar2 < 0) goto LAB_001622d4;
    if (open_req1.result._4_4_ < 0) goto LAB_001622d9;
    pcStack_4a8 = (code *)0x161fd4;
    uv_fs_req_cleanup(&open_req1);
    pcStack_4a8 = (code *)0x161fe5;
    uVar19 = (uv_buf_t)uv_buf_init("0123456789",10);
    uStack_4a0 = 0;
    pcStack_4a8 = (code *)0x162023;
    iov = uVar19;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 != 10) goto LAB_001622de;
    if (write_req.result != 10) goto LAB_001622e3;
    pcStack_4a8 = (code *)0x162048;
    uv_fs_req_cleanup(&write_req);
    lVar15 = 8;
    do {
      pcStack_4a8 = (code *)0x162062;
      auVar17 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar9 + lVar15 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar9 + lVar15) = auVar17._8_8_;
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0xd4318);
    uStack_4a0 = 0;
    pcStack_4a8 = (code *)0x1620a3;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar9,0xd431,10);
    if (iVar2 < 0) goto LAB_001622e8;
    if (write_req.result != 0xac67d) goto LAB_001622ed;
    pcStack_4a8 = (code *)0x1620c8;
    uv_fs_req_cleanup(&write_req);
    pcStack_4a8 = (code *)0x1620d2;
    pcVar10 = (char *)malloc(0xac67d);
    if (pcVar10 == (char *)0x0) goto LAB_001622f2;
    lVar15 = 8;
    pcVar13 = pcVar10;
    do {
      pcStack_4a8 = (code *)0x1620f4;
      auVar17 = uv_buf_init(pcVar13,0xd);
      *(long *)((long)pvVar9 + lVar15 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar9 + lVar15) = auVar17._8_8_;
      lVar15 = lVar15 + 0x10;
      pcVar13 = pcVar13 + 0xd;
    } while (lVar15 != 0xd4318);
    uStack_4a0 = 0;
    pcStack_4a8 = (code *)0x162136;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar9,0xd431,10);
    if (iVar2 < 0) goto LAB_001622f7;
    lStack_490 = 10;
    lVar15 = 0xd;
    if (iVar2 != 0xd) {
      lVar15 = 0x3400;
    }
    if (read_req.result != lVar15) goto LAB_001622fc;
    pcVar13 = pcVar10;
    uVar14 = 0;
    do {
      pcStack_4a8 = (code *)0x162180;
      iVar4 = strncmp(pcVar13,test_buf,0xd);
      if (iVar4 != 0) {
        pcStack_4a8 = (code *)0x1622cf;
        fs_write_alotof_bufs_with_offset_cold_9();
        pvVar8 = pvVar9;
        goto LAB_001622cf;
      }
      if (iVar2 == 0xd) break;
      pcVar13 = pcVar13 + 0xd;
      bVar1 = uVar14 < 0x3ff;
      uVar14 = uVar14 + 1;
    } while (bVar1);
    pcStack_4a8 = (code *)0x1621ad;
    uv_fs_req_cleanup(&read_req);
    pcStack_4a8 = (code *)0x1621b5;
    free(pcVar10);
    pcStack_4a8 = (code *)0x1621cc;
    iVar2 = uv_fs_stat(0,&stat_req,"test_file",0);
    lVar15 = lStack_490;
    if (iVar2 != 0) goto LAB_00162301;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + lStack_490) goto LAB_00162306;
    pcStack_4a8 = (code *)0x162200;
    uv_fs_req_cleanup(&stat_req);
    pcStack_4a8 = (code *)0x162211;
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_4a0 = 0;
    pcStack_4a8 = (code *)0x162252;
    iov = uVar19;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,lVar15 + write_req.result);
    if (iVar2 != 0) goto LAB_0016230b;
    if (read_req.result != 0) goto LAB_00162310;
    pcStack_4a8 = (code *)0x162274;
    uv_fs_req_cleanup(&read_req);
    pcStack_4a8 = (code *)0x16228a;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00162315;
    if (close_req.result == 0) {
      pcStack_4a8 = (code *)0x1622a8;
      uv_fs_req_cleanup(&close_req);
      pcStack_4a8 = (code *)0x1622b4;
      unlink("test_file");
      free(pvVar9);
      return;
    }
  }
  pcStack_4a8 = run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  pcStack_4a8 = (code *)pvVar9;
  loop = (uv_loop_t *)uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_00162496;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,0);
    if (iVar2 < 0) goto LAB_0016249b;
    uv_fs_req_cleanup(&open_req1);
    uVar19 = (uv_buf_t)uv_buf_init(auStack_4aa,2);
    iov = uVar19;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0,0);
    if (iVar2 != -0x15) goto LAB_001624a0;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      uVar5 = uv_default_loop();
      uv_walk(uVar5,close_walk_cb,0);
      uv_run(uVar5,0);
      uVar5 = uv_default_loop();
      iVar2 = uv_loop_close(uVar5);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001624aa;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_00162496:
    run_test_fs_read_dir_cold_2();
LAB_0016249b:
    run_test_fs_read_dir_cold_3();
LAB_001624a0:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_001624aa:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return;
}

Assistant:

static void open_cb_simple(uv_fs_t* req) {
  ASSERT(req->fs_type == UV_FS_OPEN);
  if (req->result < 0) {
    fprintf(stderr, "async open error: %d\n", (int) req->result);
    ASSERT(0);
  }
  open_cb_count++;
  ASSERT(req->path);
  uv_fs_req_cleanup(req);
}